

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O2

void newbltchar(LispPTR *args)

{
  DLword *ybase;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  LispPTR LVar5;
  uint uVar6;
  int iVar7;
  LispPTR *pLVar8;
  LispPTR *pLVar9;
  sbyte sVar10;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint *puVar19;
  ushort uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint *puVar26;
  uint *puVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint *puVar31;
  int local_94;
  uint local_84;
  uint local_68;
  uint local_64;
  uint local_60;
  sbyte sVar11;
  
  pLVar8 = NativeAligned4FromLAddr(args[2]);
  if (((ushort)((ushort)*args >> 8) == (ushort)pLVar8[0x1f]) && (pLVar8[7] == 0)) {
    uVar29 = *pLVar8;
    if ((uVar29 & 0xfff0000) == 0xf0000) {
      uVar29 = uVar29 | 0xffff0000;
    }
    else {
      if ((uVar29 & 0xfff0000) != 0xe0000) goto LAB_0010dab0;
      uVar29 = uVar29 & 0xffff;
    }
    uVar12 = pLVar8[0xc];
    if ((uVar12 & 0xfff0000) == 0xf0000) {
      uVar12 = uVar12 | 0xffff0000;
    }
    else {
      if ((uVar12 & 0xfff0000) != 0xe0000) goto LAB_0010dab0;
      uVar12 = uVar12 & 0xffff;
    }
    uVar21 = pLVar8[0xd];
    if ((uVar21 & 0xfff0000) == 0xf0000) {
      uVar21 = uVar21 | 0xffff0000;
    }
    else {
      if ((uVar21 & 0xfff0000) != 0xe0000) goto LAB_0010dab0;
      uVar21 = uVar21 & 0xffff;
    }
    uVar16 = pLVar8[2];
    if ((uVar16 & 0xfff0000) == 0xf0000) {
      uVar16 = uVar16 | 0xffff0000;
    }
    else {
      if ((uVar16 & 0xfff0000) != 0xe0000) goto LAB_0010dab0;
      uVar16 = uVar16 & 0xffff;
    }
    uVar23 = (uint)(byte)(ushort)*args;
    iVar18 = *(ushort *)((ulong)(Lisp_world + (pLVar8[0x18] + uVar23)) ^ 2) + uVar29;
    if ((((int)uVar29 <= (int)uVar21) || (iVar18 <= (int)uVar12)) && (args[1] == *TOPWDS68k)) {
      uVar12 = uVar29 + *(ushort *)((ulong)(Lisp_world + (uVar23 + pLVar8[8])) ^ 2);
      LVar5 = uVar29 + 0xe0000 + (uint)*(ushort *)((ulong)(Lisp_world + (uVar23 + pLVar8[8])) ^ 2);
      if (0xffff < uVar12) {
        LVar5 = uVar12 & 0xffff | 0xf0000;
      }
      *pLVar8 = LVar5;
      uVar29 = uVar29 + uVar16;
      uVar16 = iVar18 + uVar16;
      if ((int)(uint)(ushort)pLVar8[0x11] <= (int)uVar16) {
        uVar16 = (uint)(ushort)pLVar8[0x11];
      }
      uVar12 = (uint)*(ushort *)((long)pLVar8 + 0x46);
      if ((int)(uint)*(ushort *)((long)pLVar8 + 0x46) < (int)uVar29) {
        uVar12 = uVar29;
      }
      pLVar9 = NativeAligned4FromLAddr(pLVar8[0x15]);
      uVar1 = (ushort)pLVar9[4];
      if ((uVar1 != 0) && (iVar18 = uVar16 - uVar12, 0 < iVar18)) {
        ybase = Lisp_world + ((ulong)*(ushort *)((long)pLVar9 + 2) | (ulong)(*pLVar9 << 0x10));
        uVar2 = *(ushort *)((long)pLVar9 + 0x16);
        uVar14 = uVar2 >> 9 & 3;
        uVar3 = (ushort)pLVar9[3];
        uVar20 = -uVar3;
        if (0 < (short)uVar3) {
          uVar20 = uVar3;
        }
        uVar3 = (ushort)pLVar9[1];
        uVar15 = -uVar3;
        if (0 < (short)uVar3) {
          uVar15 = uVar3;
        }
        uVar13 = (ulong)(uVar12 >> 3) + (long)ybase;
        puVar19 = (uint *)(uVar13 & 0xfffffffffffffffc);
        uVar21 = (uVar12 & 7) + ((uint)uVar13 & 3) * 8;
        local_60 = (iVar18 + uVar21) - 1 & 0x1f;
        uVar16 = -(uint)(uVar21 == 0) | ~(-1 << (-(char)uVar21 & 0x1fU));
        local_84 = -1 << (~(byte)local_60 & 0x1f);
        uVar29 = (uVar12 - uVar29) +
                 (uint)*(ushort *)((ulong)(Lisp_world + ((uint)(byte)*args + pLVar8[9])) ^ 2);
        ScreenLocked = 1;
        if ((int)uVar29 < 0) {
          uVar13 = -(ulong)(7 - uVar29 >> 3);
        }
        else {
          uVar13 = (ulong)(uVar29 >> 3);
        }
        uVar13 = (long)Lisp_world +
                 uVar13 + ((ulong)*(ushort *)((long)pLVar9 + 10) | (ulong)(pLVar9[2] << 0x10)) * 2;
        local_64 = local_84 & uVar16;
        local_94 = (uVar21 + iVar18 >> 5) - 1;
        uVar29 = (uVar29 & 7) + ((uint)uVar13 & 3) * 8;
        uVar17 = uVar29 - uVar21 & 0x1f;
        uVar28 = 0;
        uVar30 = -(uint)(uVar17 == 0) | ~(-1 << (sbyte)uVar17);
        uVar24 = uVar21 - uVar29 & 0x1f;
        local_68 = iVar18 + uVar29 + 0x1f & 0x1f;
        puVar27 = (uint *)(uVar13 & 0xfffffffffffffffc);
        uVar6 = -(uVar2 >> 0xb & 1);
        for (uVar23 = (uint)uVar1; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          uVar25 = *puVar27;
          sVar10 = (sbyte)uVar24;
          sVar11 = (sbyte)uVar17;
          if ((uVar21 < uVar29) && (0x20 < (int)(uVar29 + iVar18))) {
            puVar26 = puVar27 + 2;
            uVar22 = puVar27[1] >> sVar10 & uVar30 | uVar25 << sVar11;
            uVar28 = puVar27[1] << sVar11 & ~uVar30;
          }
          else {
            puVar26 = puVar27 + 1;
            if (uVar21 < uVar29) {
              uVar22 = uVar25 << sVar11;
            }
            else {
              uVar22 = uVar25 >> sVar10 & uVar30;
              uVar28 = uVar25 << sVar11 & ~uVar30;
            }
          }
          uVar22 = uVar22 ^ uVar6;
          puVar31 = puVar19;
          uVar25 = local_64;
          if ((int)(uVar21 + iVar18) < 0x21) {
LAB_0010e1e3:
            uVar4 = *puVar31;
            switch(uVar14) {
            case 1:
              uVar22 = uVar22 & uVar4;
              break;
            case 2:
              uVar22 = uVar22 | uVar4;
              break;
            case 3:
              uVar22 = uVar22 ^ uVar4;
            }
            *puVar31 = uVar4 & ~uVar25 | uVar22 & uVar25;
          }
          else {
            uVar25 = *puVar19;
            switch(uVar14) {
            case 1:
              uVar22 = uVar22 & uVar25;
              break;
            case 2:
              uVar22 = uVar22 | uVar25;
              break;
            case 3:
              uVar22 = uVar22 ^ uVar25;
            }
            *puVar19 = uVar22 & uVar16 | uVar25 & ~uVar16;
            puVar31 = puVar19 + 1;
            if (uVar29 == uVar21) {
              if ((uVar2 >> 0xb & 1) == 0) {
                switch(uVar14) {
                case 0:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = uVar25;
                    puVar31 = puVar31 + 1;
                  }
                  break;
                case 1:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = *puVar31 & uVar25;
                    puVar31 = puVar31 + 1;
                  }
                  break;
                case 2:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = *puVar31 | uVar25;
                    puVar31 = puVar31 + 1;
                  }
                  break;
                case 3:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = *puVar31 ^ uVar25;
                    puVar31 = puVar31 + 1;
                  }
                }
              }
              else {
                switch(uVar14) {
                case 0:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = ~uVar25;
                    puVar31 = puVar31 + 1;
                  }
                  break;
                case 1:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = *puVar31 & ~uVar25;
                    puVar31 = puVar31 + 1;
                  }
                  break;
                case 2:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = *puVar31 | ~uVar25;
                    puVar31 = puVar31 + 1;
                  }
                  break;
                case 3:
                  for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                    uVar25 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar31 = ~(uVar25 ^ *puVar31);
                    puVar31 = puVar31 + 1;
                  }
                }
              }
            }
            else if ((uVar2 >> 0xb & 1) == 0) {
              switch(uVar14) {
              case 0:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26;
                  puVar26 = puVar26 + 1;
                  *puVar31 = uVar25 >> sVar10 | uVar28;
                  puVar31 = puVar31 + 1;
                  uVar28 = uVar25 << sVar11;
                }
                break;
              case 1:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26;
                  *puVar31 = *puVar31 & (uVar25 >> sVar10 | uVar28);
                  puVar26 = puVar26 + 1;
                  puVar31 = puVar31 + 1;
                  uVar28 = uVar25 << sVar11;
                }
                break;
              case 2:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26;
                  puVar26 = puVar26 + 1;
                  *puVar31 = uVar25 >> sVar10 | *puVar31 | uVar28;
                  puVar31 = puVar31 + 1;
                  uVar28 = uVar25 << sVar11;
                }
                break;
              case 3:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26;
                  *puVar31 = *puVar31 ^ (uVar25 >> sVar10 | uVar28);
                  puVar26 = puVar26 + 1;
                  puVar31 = puVar31 + 1;
                  uVar28 = uVar25 << sVar11;
                }
              }
            }
            else {
              switch(uVar14) {
              case 0:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26;
                  puVar26 = puVar26 + 1;
                  uVar22 = uVar25 >> sVar10 | uVar28;
                  uVar28 = uVar25 << sVar11;
                  *puVar31 = ~uVar22;
                  puVar31 = puVar31 + 1;
                }
                break;
              case 1:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26 >> sVar10 | uVar28;
                  uVar28 = *puVar26 << sVar11;
                  *puVar31 = *puVar31 & ~uVar25;
                  puVar26 = puVar26 + 1;
                  puVar31 = puVar31 + 1;
                }
                break;
              case 2:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26 >> sVar10 | uVar28;
                  uVar28 = *puVar26 << sVar11;
                  *puVar31 = *puVar31 | ~uVar25;
                  puVar26 = puVar26 + 1;
                  puVar31 = puVar31 + 1;
                }
                break;
              case 3:
                for (iVar7 = local_94; 0 < iVar7; iVar7 = iVar7 + -1) {
                  uVar25 = *puVar26;
                  puVar26 = puVar26 + 1;
                  *puVar31 = ~((uVar25 >> sVar10 | uVar28) ^ *puVar31);
                  puVar31 = puVar31 + 1;
                  uVar28 = uVar25 << sVar11;
                }
              }
            }
            if (local_60 != 0x1f) {
              uVar22 = uVar28;
              if (local_68 <= local_60) {
                uVar22 = *puVar26 >> sVar10 & uVar30 | uVar28;
              }
              uVar22 = uVar22 ^ uVar6;
              uVar25 = local_84;
              goto LAB_0010e1e3;
            }
          }
          uVar25 = (uint)uVar20;
          uVar22 = (uint)uVar15;
          if (((uVar15 | uVar20) & 0x1f) != 0) {
            uVar22 = uVar21 + uVar15;
            uVar21 = uVar22 & 0x1f;
            local_60 = (uVar21 + iVar18) - 1 & 0x1f;
            uVar16 = -(uint)(uVar21 == 0) | ~(-1 << (-(char)uVar21 & 0x1fU));
            local_84 = -1 << (~(byte)local_60 & 0x1f);
            local_64 = local_84 & uVar16;
            local_94 = (uVar21 + iVar18 >> 5) - 1;
            uVar25 = uVar29 + uVar20;
            uVar29 = uVar25 & 0x1f;
            local_68 = iVar18 + 0x1f + uVar25 & 0x1f;
            uVar24 = uVar22 - uVar25 & 0x1f;
            uVar17 = uVar25 - uVar22 & 0x1f;
            uVar30 = -(uint)(uVar17 == 0) | ~(-1 << (sbyte)uVar17);
          }
          puVar19 = puVar19 + (uVar22 >> 5);
          puVar27 = puVar27 + (uVar25 >> 5);
        }
        if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
          flush_display_lineregion((ulong)uVar12,ybase,iVar18,(uint)uVar1);
        }
        ScreenLocked = 0;
      }
      return;
    }
  }
LAB_0010dab0:
  if ((BLTCHAR_index == 0) &&
     (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
     BLTCHAR_index == 0xffffffff)) {
    error("\\MAIKO.PUNTBLTCHAR install failed");
    return;
  }
  MachineState.csp = MachineState.csp + 4;
  ccfuncall(BLTCHAR_index,3,3);
  return;
}

Assistant:

void newbltchar(LispPTR *args) {
  DISPLAYDATA *displaydata68k;
  int right, left, curx;
  PILOTBBT *pbt;
  int lmargin, rmargin, xoff;
  int base;
  int h, w;
#ifdef REALCURSOR
  int displayflg;
#endif
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  displaydata68k = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTARG *)args)->displaydata);

  if ((displaydata68k->ddcharset & 0xFFFF) != ((BLTARG *)args)->charset) {
    /*if(changecharset_display(displaydata68k, ((BLTARG *)args)->charset) ==-1)*/
    PUNT_TO_BLTCHAR;
  }

  if (displaydata68k->ddslowprintingcase) { PUNT_TO_BLTCHAR; /** \SLOWBLTCHAR--return;**/ }

  FGetNum(displaydata68k->ddxposition, curx);
  FGetNum(displaydata68k->ddrightmargin, rmargin);
  FGetNum(displaydata68k->ddleftmargin, lmargin);
  FGetNum(displaydata68k->ddxoffset, xoff);

  right =
      curx +
      GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddcharimagewidths + ((BLTARG *)args)->char8code));

  if ((right > rmargin) && (curx > lmargin)) PUNT_TO_BLTCHAR;
  if (((BLTARG *)args)->displaystream != *TOPWDS68k) PUNT_TO_BLTCHAR;

  {
    int newpos;
    newpos = curx +
             GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddwidthscache + ((BLTARG *)args)->char8code));

    if ((0 <= newpos) && (newpos < 65536))
      (displaydata68k->ddxposition) = (LispPTR)(S_POSITIVE | newpos);
    else if (-65537 < newpos)
      (displaydata68k->ddxposition) = (LispPTR)(S_NEGATIVE | (0xffff & newpos));
    else {
      PUNT_TO_BLTCHAR;
    }
  }

  curx += xoff;
  right += xoff;
  if (right > (int)(displaydata68k->ddclippingright)) right = displaydata68k->ddclippingright;

  if (curx > (int)(displaydata68k->ddclippingleft))
    left = curx;
  else
    left = displaydata68k->ddclippingleft;

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(displaydata68k->ddpilotbbt);
  h = pbt->pbtheight;
  w = right - left;
  if ((h <= 0) || (w <= 0)) return;

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  base = GETWORD(NativeAligned2FromLAddr(displaydata68k->ddoffsetscache + ((BLTARG *)args)->char8code));
  sx = base + left - curx;
  dx = left;

  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg = (cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (left >> 4)), (right - left),
                         pbt->pbtheight, pbt->pbtbackward));
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("newbltchar:  x %d, y 0x%x, w %d, h %d.\n", dx, dstbase, w, h));*/
      flush_display_lineregion(dx, dstbase, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */
#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */
#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

}